

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O1

int Saig_SynchCountX(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,int *piPat)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  void *__ptr;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  
  uVar12 = nWords * 0x10;
  __ptr = calloc((long)(int)uVar12,4);
  iVar13 = pAig->nRegs;
  if (0 < (long)iVar13) {
    pVVar4 = pAig->vCos;
    iVar8 = pAig->nTruePos;
    lVar10 = 0;
    do {
      if ((iVar8 < 0) || (lVar6 = lVar10 + iVar8, pVVar4->nSize <= lVar6)) {
LAB_006f4ac5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = *(int *)((long)pVVar4->pArray[lVar6] + 0x24);
      if (((long)iVar2 < 0) || (vSimInfo->nSize <= iVar2)) goto LAB_006f4ac5;
      if (0 < nWords) {
        pvVar5 = vSimInfo->pArray[iVar2];
        uVar11 = 0;
        do {
          uVar3 = *(uint *)((long)pvVar5 + uVar11 * 4);
          lVar6 = 0;
          do {
            if ((~(uVar3 >> ((byte)lVar6 & 0x1f)) & 3) == 0) {
              piVar1 = (int *)((long)__ptr + lVar6 * 2 + (ulong)((uint)uVar11 & 0xfffffff) * 0x40);
              *piVar1 = *piVar1 + 1;
            }
            lVar6 = lVar6 + 2;
          } while (lVar6 != 0x20);
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)nWords);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar13);
  }
  iVar13 = iVar13 + 1;
  if (nWords < 1) {
    iVar8 = -1;
  }
  else {
    uVar11 = 1;
    if (1 < (int)uVar12) {
      uVar11 = (ulong)uVar12;
    }
    uVar9 = 0xffffffff;
    uVar7 = 0;
    do {
      iVar8 = *(int *)((long)__ptr + uVar7 * 4);
      if (iVar8 < iVar13) {
        if (iVar8 == 0) {
          iVar13 = 0;
          iVar8 = (int)uVar7;
          break;
        }
        uVar9 = uVar7 & 0xffffffff;
        iVar13 = iVar8;
      }
      iVar8 = (int)uVar9;
      uVar7 = uVar7 + 1;
    } while (uVar11 != uVar7);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  *piPat = iVar8;
  return iVar13;
}

Assistant:

int Saig_SynchCountX( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, int * piPat )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int * pCounters, i, w, b;
    int iPatBest, iTernMin;
    // count the number of ternary values in each pattern
    pCounters = ABC_CALLOC( int, nWords * 16 );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            for ( b = 0; b < 16; b++ )
                if ( ((pSim[w] >> (b << 1)) & 3) == 3 )
                    pCounters[16 * w + b]++;
    }
    // get the best pattern
    iPatBest = -1;
    iTernMin = 1 + Saig_ManRegNum(pAig);
    for ( b = 0; b < 16 * nWords; b++ )
        if ( iTernMin > pCounters[b] )
        {
            iTernMin = pCounters[b];
            iPatBest = b;
            if ( iTernMin == 0 )
                break;
        }
    ABC_FREE( pCounters );
    *piPat = iPatBest;
    return iTernMin;
}